

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O2

void __thiscall
uWS::WebSocket<false>::sendPrepared
          (WebSocket<false> *this,PreparedMessage *preparedMessage,void *callbackData)

{
  undefined8 in_RAX;
  char *memory;
  ssize_t sVar1;
  size_t in_RCX;
  bool cancelled;
  uv_poll_t *webSocket;
  bool wasTransferred;
  
  wasTransferred = SUB81((ulong)in_RAX >> 0x38,0);
  preparedMessage->references = preparedMessage->references + 1;
  memory = uS::NodeData::getSmallMemoryBlock(*((this->super_Socket).p)->data,3);
  *(char **)memory = preparedMessage->buffer;
  *(size_t *)(memory + 8) = preparedMessage->length;
  sVar1 = uS::Socket::write(&this->super_Socket,(int)memory,&wasTransferred,in_RCX);
  if ((char)sVar1 == '\0') {
    webSocket = (this->super_Socket).p;
    cancelled = true;
  }
  else {
    if (wasTransferred != false) {
      *(code **)(memory + 0x18) = sendPrepared::anon_class_1_0_00000001::__invoke;
      *(PreparedMessage **)(memory + 0x20) = preparedMessage;
      *(void **)(memory + 0x28) = callbackData;
      return;
    }
    uS::NodeData::freeSmallMemoryBlock(*((this->super_Socket).p)->data,memory,3);
    webSocket = (this->super_Socket).p;
    cancelled = false;
  }
  sendPrepared::anon_class_1_0_00000001::__invoke(webSocket,preparedMessage,cancelled,callbackData);
  return;
}

Assistant:

void WebSocket<isServer>::sendPrepared(typename WebSocket<isServer>::PreparedMessage *preparedMessage, void *callbackData) {
    preparedMessage->references++;
    void (*callback)(void *webSocket, void *userData, bool cancelled, void *reserved) = [](void *webSocket, void *userData, bool cancelled, void *reserved) {
        PreparedMessage *preparedMessage = (PreparedMessage *) userData;
        bool lastReference = !--preparedMessage->references;

        if (preparedMessage->callback) {
            preparedMessage->callback(webSocket, reserved, cancelled, (void *) lastReference);
        }

        if (lastReference) {
            delete [] preparedMessage->buffer;
            delete preparedMessage;
        }
    };

    // candidate for fixed size pool allocator
    int memoryLength = sizeof(uS::SocketData::Queue::Message);
    int memoryIndex = getSocketData()->nodeData->getMemoryBlockIndex(memoryLength);

    uS::SocketData::Queue::Message *messagePtr = (uS::SocketData::Queue::Message *) getSocketData()->nodeData->getSmallMemoryBlock(memoryIndex);
    messagePtr->data = preparedMessage->buffer;
    messagePtr->length = preparedMessage->length;

    bool wasTransferred;
    if (write(messagePtr, wasTransferred)) {
        if (!wasTransferred) {
            getSocketData()->nodeData->freeSmallMemoryBlock((char *) messagePtr, memoryIndex);
            if (callback) {
                callback(*this, preparedMessage, false, callbackData);
            }
        } else {
            messagePtr->callback = callback;
            messagePtr->callbackData = preparedMessage;
            messagePtr->reserved = callbackData;
        }
    } else {
        if (callback) {
            callback(*this, preparedMessage, true, callbackData);
        }
    }
}